

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall
Js::ScriptContext::RedeferFunctionBodies
          (ScriptContext *this,ActiveFunctionSet *pActiveFuncs,uint inactiveThreshold)

{
  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
  *this_00;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar1;
  Type pcVar2;
  long *plVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined4 *puVar8;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar9;
  long lVar10;
  FunctionBody *pFVar11;
  ActiveFunctionSet *pAVar12;
  ulong uVar13;
  anon_class_24_3_5d441f8e_for_mapper local_68;
  ActiveFunctionSet *local_50;
  ActiveFunctionSet *pActiveFuncs_local;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *local_40;
  uint local_34 [2];
  uint inactiveThreshold_local;
  
  local_50 = pActiveFuncs;
  local_34[0] = inactiveThreshold;
  iVar6 = (*(this->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
  if ((char)iVar6 != '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x45e,"(!this->IsClosed())","!this->IsClosed()");
    if (!bVar5) {
LAB_007860e7:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  bVar5 = IsScriptContextInNonDebugMode(this);
  if (bVar5) {
    this_00 = &this->sourceList;
    if ((this->sourceList).ptr !=
        (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
         *)0x0) {
      local_40 = Memory::
                 RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
                 ::operator->(this_00);
      iVar6 = (local_40->
              super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
              ).count;
      if (0 < iVar6) {
        puVar8 = (undefined4 *)__tls_get_addr();
        pAVar12 = (ActiveFunctionSet *)0x0;
        pLVar9 = local_40;
        do {
          pRVar1 = (pLVar9->
                   super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                   ).buffer.ptr[(long)pAVar12].ptr;
          if (((((ulong)pRVar1 & 1) == 0 &&
                pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) &&
              (pcVar2 = (pRVar1->super_RecyclerWeakReferenceBase).strongRef, pcVar2 != (Type)0x0))
             && (plVar3 = *(long **)(pcVar2 + 0x18), plVar3 != (long *)0x0)) {
            local_68.inactiveThreshold = local_34;
            local_68.pActiveFuncs = &local_50;
            uVar7 = *(uint *)((long)plVar3 + 0x1c);
            local_68.this = this;
            if (uVar7 != 0) {
              uVar13 = 0;
              pActiveFuncs_local = pAVar12;
              do {
                iVar6 = *(int *)(*plVar3 + uVar13 * 4);
                if (iVar6 != -1) {
                  do {
                    lVar10 = (long)iVar6;
                    iVar6 = *(int *)(plVar3[1] + 8 + lVar10 * 0x10);
                    pFVar11 = *(FunctionBody **)(plVar3[1] + lVar10 * 0x10);
                    if (pFVar11 == (FunctionBody *)0x0) {
                      AssertCount = AssertCount + 1;
                      Throw::LogAssert();
                      *puVar8 = 1;
                      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                                  ,0xa2,"(functionBody)","functionBody");
                      if (!bVar5) goto LAB_007860e7;
                      *puVar8 = 0;
                      pFVar11 = (FunctionBody *)0x0;
                    }
                    anon_func::anon_class_24_1_3fcf6586::anon_class_24_1_3fcf6586_for_fn::
                    anon_class_24_1_60afaf7f_for_fn::anon_class_24_3_5d441f8e_for_mapper::operator()
                              (&local_68,pFVar11);
                  } while (iVar6 != -1);
                  uVar7 = *(uint *)((long)plVar3 + 0x1c);
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 < uVar7);
              iVar6 = (local_40->
                      super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                      ).count;
              pLVar9 = local_40;
              pAVar12 = pActiveFuncs_local;
            }
          }
          pAVar12 = (ActiveFunctionSet *)((long)&pAVar12->head + 1);
          pActiveFuncs = local_50;
        } while ((long)pAVar12 < (long)iVar6);
      }
    }
    if ((pActiveFuncs != (ActiveFunctionSet *)0x0) &&
       (this_00->ptr !=
        (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
         *)0x0)) {
      pLVar9 = Memory::
               RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
               ::operator->(this_00);
      iVar6 = (pLVar9->
              super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
              ).count;
      if (0 < iVar6) {
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        pActiveFuncs_local = (ActiveFunctionSet *)0x0;
        local_40 = pLVar9;
        do {
          pRVar1 = (pLVar9->
                   super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                   ).buffer.ptr[(long)pActiveFuncs_local].ptr;
          if (((((ulong)pRVar1 & 1) == 0 &&
                pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) &&
              (pcVar2 = (pRVar1->super_RecyclerWeakReferenceBase).strongRef, pcVar2 != (Type)0x0))
             && (plVar3 = *(long **)(pcVar2 + 0x18), plVar3 != (long *)0x0)) {
            local_68.inactiveThreshold = (uint *)&local_50;
            local_68.pActiveFuncs = (ActiveFunctionSet **)local_34;
            uVar7 = *(uint *)((long)plVar3 + 0x1c);
            if (uVar7 != 0) {
              uVar13 = 0;
              do {
                iVar6 = *(int *)(*plVar3 + uVar13 * 4);
                if (iVar6 != -1) {
                  do {
                    lVar10 = (long)iVar6;
                    iVar6 = *(int *)(plVar3[1] + 8 + lVar10 * 0x10);
                    pFVar11 = *(FunctionBody **)(plVar3[1] + lVar10 * 0x10);
                    if (pFVar11 == (FunctionBody *)0x0) {
                      AssertCount = AssertCount + 1;
                      Throw::LogAssert();
                      *puVar8 = 1;
                      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                                  ,0xa2,"(functionBody)","functionBody");
                      if (!bVar5) goto LAB_007860e7;
                      *puVar8 = 0;
                      pFVar11 = (FunctionBody *)0x0;
                    }
                    anon_func::anon_class_16_1_3fcf6586::anon_class_16_1_3fcf6586_for_fn::
                    anon_class_16_1_60afaf7f_for_fn::anon_class_16_2_46a5a072_for_mapper::operator()
                              ((anon_class_16_2_46a5a072_for_mapper *)&local_68,pFVar11);
                  } while (iVar6 != -1);
                  uVar7 = *(uint *)((long)plVar3 + 0x1c);
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 < uVar7);
              iVar6 = (local_40->
                      super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                      ).count;
              pLVar9 = local_40;
            }
          }
          pActiveFuncs_local = (ActiveFunctionSet *)((long)&pActiveFuncs_local->head + 1);
        } while ((long)pActiveFuncs_local < (long)iVar6);
      }
    }
  }
  return;
}

Assistant:

void ScriptContext::RedeferFunctionBodies(ActiveFunctionSet *pActiveFuncs, uint inactiveThreshold)
    {
        Assert(!this->IsClosed());

        if (!this->IsScriptContextInNonDebugMode())
        {
            return;
        }

        // For each active function, collect call counts, update inactive counts, and redefer if appropriate.
        // In the redeferral case, we require 2 passes over the set of FunctionBody's.
        // This is because a function inlined in a non-redeferred function cannot itself be redeferred.
        // So we first need to close over the set of non-redeferrable functions, then go back and redefer
        // the eligible candidates.

        auto fn = [&](FunctionBody *functionBody) {
            bool exec = functionBody->InterpretedSinceCallCountCollection();
            functionBody->CollectInterpretedCounts();
            functionBody->MapEntryPoints([&](int index, FunctionEntryPointInfo *entryPointInfo) {
                if (!entryPointInfo->IsCleanedUp() && entryPointInfo->ExecutedSinceCallCountCollection())
                {
                    exec = true;
                }
                entryPointInfo->CollectCallCounts();
            });
            if (exec)
            {
                functionBody->SetInactiveCount(0);
            }
            else
            {
                functionBody->IncrInactiveCount(inactiveThreshold);
            }

            if (pActiveFuncs)
            {
                Assert(this->GetThreadContext()->DoRedeferFunctionBodies());
                bool doRedefer = functionBody->DoRedeferFunction(inactiveThreshold);
                if (!doRedefer)
                {
                    functionBody->UpdateActiveFunctionSet(pActiveFuncs, nullptr);
                }
            }
        };

        this->MapFunction(fn);

        if (!pActiveFuncs)
        {
            return;
        }

        auto fnRedefer = [&](FunctionBody * functionBody) {
            Assert(pActiveFuncs);
            if (!functionBody->IsActiveFunction(pActiveFuncs))
            {
                Assert(functionBody->DoRedeferFunction(inactiveThreshold));
                functionBody->RedeferFunction();
            }
            else
            {
                functionBody->ResetRedeferralAttributes();
            }
        };

        this->MapFunction(fnRedefer);
    }